

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

uint readuint(FILE *f,int bigendian)

{
  undefined8 in_RAX;
  size_t sVar1;
  uint uVar2;
  uchar c4;
  uchar c3;
  uchar c2;
  uchar c1;
  undefined4 local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  sVar1 = fread((void *)((long)&local_14 + 3),1,1,(FILE *)f);
  if (sVar1 == 0) {
    readuint_cold_4();
  }
  else {
    sVar1 = fread((void *)((long)&local_14 + 2),1,1,(FILE *)f);
    if (sVar1 == 0) {
      readuint_cold_3();
    }
    else {
      sVar1 = fread((void *)((long)&local_14 + 1),1,1,(FILE *)f);
      if (sVar1 == 0) {
        readuint_cold_2();
      }
      else {
        sVar1 = fread(&local_14,1,1,(FILE *)f);
        if (sVar1 != 0) {
          if (bigendian == 0) {
            uVar2 = (uint)local_14._2_1_ << 8 | (uint)local_14._1_1_ << 0x10 | local_14 << 0x18;
            local_14._0_1_ = local_14._3_1_;
          }
          else {
            uVar2 = (uint)local_14._1_1_ << 8 |
                    (uint)local_14._2_1_ << 0x10 | (uint)local_14._3_1_ << 0x18;
          }
          return (byte)local_14 | uVar2;
        }
        readuint_cold_1();
      }
    }
  }
  return 0;
}

Assistant:

static unsigned int readuint(FILE * f, int bigendian)
{
    unsigned char c1, c2, c3, c4;
    if (!fread(&c1, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if (!fread(&c2, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if (!fread(&c3, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if (!fread(&c4, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    if (bigendian) {
        return (unsigned int)(c1 << 24) + (unsigned int)(c2 << 16) + (unsigned int)(
                   c3 << 8) + c4;
    } else {
        return (unsigned int)(c4 << 24) + (unsigned int)(c3 << 16) + (unsigned int)(
                   c2 << 8) + c1;
    }
}